

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
::UntypedDescribeUninterestingCall
          (FunctionMocker<ot::commissioner::Error_(std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
           *this,void *untyped_args,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  ArgumentTuple *args;
  ostream *os_local;
  void *untyped_args_local;
  FunctionMocker<ot::commissioner::Error_(std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&)>
  *this_local;
  
  std::operator<<(os,"Uninteresting mock function call - ");
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  poVar1 = std::operator<<(os,"    Function call: ");
  pcVar2 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
  std::operator<<(poVar1,pcVar2);
  UniversalPrint<std::tuple<std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>&>>
            ((tuple<std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
              *)untyped_args,os);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }